

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O2

_Bool borg_check_rest(wchar_t y,wchar_t x)

{
  wchar_t y_00;
  uint uVar1;
  bool bVar2;
  chunk_conflict *c;
  monster_race *pmVar3;
  borg_kill *pbVar4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t wVar7;
  loc grid;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  
  if ((((borg.trait[0x1b] != borg.trait[0x1c]) ||
       (_Var5 = flag_has_dbg((player->state).pflags,3,0x11,"player->state.pflags",
                             "(PF_COMBAT_REGEN)"), !_Var5)) &&
      (borg_t < borg.when_last_kill_mult || (int)borg.when_last_kill_mult <= borg_t + -4)) &&
     (((((borg.temp.bless == false && (borg.temp.hero == false)) &&
        ((borg.temp.berserk == false &&
         ((borg.temp.fastcast == false && (borg.temp.regen == false)))))) &&
       (borg.temp.smite_evil != true)) ||
      (((borg.munchkin_mode != false || (borg.trait[0x1b] < (borg.trait[0x1c] << 3) / 10)) ||
       (borg.trait[0x1e] < (borg.trait[0x1f] * 7) / 10)))))) {
    borg.when_last_kill_mult = 0;
    if (vault_on_level == true) {
      bVar2 = false;
      for (iVar14 = -1; iVar14 != 1; iVar14 = iVar14 + 1) {
        lVar13 = -1;
        iVar12 = 2;
        while (c = cave, bVar15 = iVar12 != 0, iVar12 = iVar12 + -1, bVar15) {
          grid = (loc)loc(borg.c.x + (int)lVar13,borg.c.y + iVar14);
          _Var5 = square_in_bounds_fully(c,grid);
          if (_Var5) {
            bVar2 = (bool)(bVar2 | borg_grids[(long)borg.c.y + (long)iVar14][borg.c.x + lVar13].feat
                                   == '\x16');
          }
          lVar13 = lVar13 + 1;
        }
      }
    }
    else {
      bVar2 = false;
    }
    if (((borg.no_rest_prep < 1) || (borg.munchkin_mode != false)) ||
       ((borg.trait[0x1e] <= borg.trait[0x1f] / 4 || (0x54 < borg.trait[0x69])))) {
      if (((borg_grids[y][x].feat != '\x17') || (borg.trait[0x40] != 0)) &&
         ((bVar2 || ((((((int)(uint)borg_fear_region[y / 0xb][x / 0xb] <= borg.trait[0x1b] / 0x14 ||
                        (borg.trait[0x69] == 100)) &&
                       (((int)(uint)borg_fear_monsters[y][x] <= borg.trait[0x1b] / 10 ||
                        (borg.trait[0x69] == 100)))) &&
                      ((wVar7 = borg_danger(y,x,L'\x01',true,false),
                       wVar7 <= borg.trait[0x1b] / 0x28 || (borg.trait[0x69] < 0x55)))) &&
                     (((borg.trait[0x1a] != 0 && ((borg.trait[0x6c] == 0 && (1 < borg.trait[0x27])))
                       ) || (borg.munchkin_mode == true)))))))) {
        lVar13 = 1;
        lVar11 = 0x1d8;
        do {
          pbVar4 = borg_kills;
          pmVar3 = r_info;
          bVar15 = borg_kills_nxt <= lVar13;
          if (borg_kills_nxt <= lVar13) {
            return bVar15;
          }
          uVar8 = (ulong)*(ushort *)(borg_kills->spell + lVar11 + -0x19);
          if (uVar8 != 0) {
            wVar7 = *(wchar_t *)(borg_kills->spell + lVar11 + -0xd);
            y_00 = *(wchar_t *)(borg_kills->spell + lVar11 + -9);
            uVar9 = wVar7 - x;
            uVar1 = -uVar9;
            if (0 < (int)uVar9) {
              uVar1 = uVar9;
            }
            uVar10 = y_00 - y;
            uVar9 = -uVar10;
            if (0 < (int)uVar10) {
              uVar9 = uVar10;
            }
            if (uVar9 < uVar1) {
              uVar9 = uVar1;
            }
            if (uVar9 <= z_info->max_range) {
              if (uVar9 < 2) {
                _Var5 = flag_has_dbg(r_info[uVar8].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
                if (uVar9 == 1) {
                  return bVar15;
                }
                if (!_Var5) {
                  return bVar15;
                }
LAB_0020b548:
                _Var5 = flag_has_dbg(pmVar3[uVar8].flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
                if (_Var5) {
                  return bVar15;
                }
              }
              else if (uVar9 < 10) goto LAB_0020b548;
              if (((uVar9 < 9) || (pbVar4->spell[lVar11 + -0x16] != '\0')) ||
                 (borg.munchkin_mode == true)) {
                wVar6 = borg_danger_one_kill(y_00,wVar7,L'\x01',(wchar_t)lVar13,true,true);
                if (((uVar9 < 5 && !bVar2) && (avoidance / 3 < wVar6)) &&
                   (borg.munchkin_mode != true)) {
                  return bVar15;
                }
                _Var5 = borg_los(y_00,wVar7,y,x);
                if ((_Var5) && (pbVar4->spell[lVar11 + -1] != '\0')) {
                  return bVar15;
                }
                if ((((borg.munchkin_mode == true) && (_Var5 = borg_los(y_00,wVar7,y,x), _Var5)) &&
                    (pbVar4->spell[lVar11 + -0x16] == '\x01')) &&
                   (_Var5 = flag_has_dbg(pmVar3[uVar8].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"
                                        ), !_Var5)) {
                  return bVar15;
                }
                _Var5 = flag_has_dbg(pmVar3[uVar8].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
                if ((~_Var5 & 1U) == 0 && !bVar2) {
                  return bVar15;
                }
                _Var5 = flag_has_dbg(pmVar3[uVar8].flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
                if ((~_Var5 & 1U) == 0 && !bVar2) {
                  return bVar15;
                }
              }
            }
          }
          lVar13 = lVar13 + 1;
          lVar11 = lVar11 + 0x1d8;
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool borg_check_rest(int y, int x)
{
    int  i, ii;
    bool borg_in_vault = false;

    /* never rest to recover SP (if HP at max) if you only recover */
    /* sp in combat */
    if (borg.trait[BI_CURHP] == borg.trait[BI_MAXHP]
        && player_has(player, PF_COMBAT_REGEN))
        return false;

    /* Do not rest recently after killing a multiplier */
    /* This will avoid the problem of resting next to */
    /* an unkown area full of breeders */
    if (borg.when_last_kill_mult > (borg_t - 4)
        && borg.when_last_kill_mult <= borg_t)
        return false;

    /* No resting if Blessed and good HP and good SP */
    /* don't rest for SP if you do combat regen */
    if ((borg.temp.bless || borg.temp.hero || borg.temp.berserk
            || borg.temp.fastcast || borg.temp.regen || borg.temp.smite_evil)
        && !borg.munchkin_mode
        && (borg.trait[BI_CURHP] >= borg.trait[BI_MAXHP] * 8 / 10)
        && (borg.trait[BI_CURSP] >= borg.trait[BI_MAXSP] * 7 / 10))
        return false;

    /* Set this to Zero */
    borg.when_last_kill_mult = 0;

    /* Most of the time, its ok to rest in a vault */
    if (vault_on_level) {
        for (i = -1; i < 1; i++) {
            for (ii = -1; ii < 1; ii++) {
                /* check bounds */
                if (!square_in_bounds_fully(
                        cave, loc(borg.c.x + ii, borg.c.y + i)))
                    continue;

                if (borg_grids[borg.c.y + i][borg.c.x + ii].feat == FEAT_PERM)
                    borg_in_vault = true;
            }
        }
    }

    /* No resting to recover if I just cast a prepatory spell
     * which is what I like to do right before I take a stair,
     * Unless I am down by three quarters of my SP.
     */
    if (borg.no_rest_prep >= 1 && !borg.munchkin_mode
        && borg.trait[BI_CURSP] > borg.trait[BI_MAXSP] / 4
        && borg.trait[BI_CDEPTH] < 85)
        return false;

    /* Don't rest on lava unless we are immune to fire */
    if (borg_grids[y][x].feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
        return false;

    /* Dont worry about fears if in a vault */
    if (!borg_in_vault) {
        /* Be concerned about the Regional Fear. */
        if (borg_fear_region[y / 11][x / 11] > borg.trait[BI_CURHP] / 20
            && borg.trait[BI_CDEPTH] != 100)
            return false;

        /* Be concerned about the Monster Fear. */
        if (borg_fear_monsters[y][x] > borg.trait[BI_CURHP] / 10
            && borg.trait[BI_CDEPTH] != 100)
            return false;

        /* Be concerned about the Monster Danger. */
        if (borg_danger(y, x, 1, true, false) > borg.trait[BI_CURHP] / 40
            && borg.trait[BI_CDEPTH] >= 85)
            return false;

        /* Be concerned if low on food */
        if ((borg.trait[BI_LIGHT] == 0 || borg.trait[BI_ISWEAK]
                || borg.trait[BI_FOOD] < 2)
            && !borg.munchkin_mode)
            return false;
    }

    /* Examine all the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill           *kill  = &borg_kills[i];
        struct monster_race *r_ptr = &r_info[kill->r_idx];

        int x9                     = kill->pos.x;
        int y9                     = kill->pos.y;
        int ax, ay, d;
        int p = 0;

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Distance components */
        ax = (x9 > x) ? (x9 - x) : (x - x9);
        ay = (y9 > y) ? (y9 - y) : (y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* Minimal distance */
        if (d > z_info->max_range)
            continue;

        /* if too close to a Mold or other Never-Mover, don't rest */
        if (d < 2 && !(rf_has(r_ptr->flags, RF_NEVER_MOVE)))
            return false;
        if (d == 1)
            return false;

        /* if too close to a Multiplier, don't rest */
        if (d < 10 && (rf_has(r_ptr->flags, RF_MULTIPLY)))
            return false;

        /* If monster is asleep, dont worry */
        if (!kill->awake && d > 8 && !borg.munchkin_mode)
            continue;

        /* one call for dangers */
        p = borg_danger_one_kill(y9, x9, 1, i, true, true);

        /* Ignore proximity checks while inside a vault */
        if (!borg_in_vault) {
            /* Real scary guys pretty close */
            if (d < 5 && (p > avoidance / 3) && !borg.munchkin_mode)
                return false;

            /* scary guys far away */
            /*if (d < 17 && d > 5 && (p > avoidance/3)) return false; */
        }

        /* should check LOS... monster to me concerned for Ranged Attacks */
        if (borg_los(y9, x9, y, x) && kill->ranged_attack)
            return false;

        /* Special handling for the munchkin mode */
        if (borg.munchkin_mode && borg_los(y9, x9, y, x)
            && (kill->awake && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))))
            return false;

        /* if it walks through walls, not safe */
        if ((rf_has(r_ptr->flags, RF_PASS_WALL)) && !borg_in_vault)
            return false;
        if (rf_has(r_ptr->flags, RF_KILL_WALL) && !borg_in_vault)
            return false;
    }
    return true;
}